

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::GetCurrentExecutableDirectory_abi_cxx11_(void)

{
  reference pathname;
  string *psVar1;
  string *in_RDI;
  FilePath local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined1 local_30 [8];
  FilePath argv_0;
  
  internal::GetArgvs_abi_cxx11_();
  pathname = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_48,0);
  internal::FilePath::FilePath((FilePath *)local_30,pathname);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  internal::FilePath::RemoveFileName(&local_78,(FilePath *)local_30);
  psVar1 = internal::FilePath::string_abi_cxx11_(&local_78);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  internal::FilePath::~FilePath(&local_78);
  internal::FilePath::~FilePath((FilePath *)local_30);
  return in_RDI;
}

Assistant:

static std::string GetCurrentExecutableDirectory() {
  internal::FilePath argv_0(internal::GetArgvs()[0]);
  return argv_0.RemoveFileName().string();
}